

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O1

BuildValue * __thiscall
llbuild::buildsystem::BuildValue::operator=(BuildValue *this,BuildValue *rhs)

{
  char *pcVar1;
  long lVar2;
  anon_union_80_2_ecfed234_for_valueData *paVar3;
  anon_union_80_2_ecfed234_for_valueData *paVar4;
  byte bVar5;
  
  bVar5 = 0;
  if (this != rhs) {
    if ((1 < this->numOutputInfos) && ((this->valueData).asOutputInfos != (FileInfo *)0x0)) {
      operator_delete__((this->valueData).asOutputInfos);
    }
    this->kind = rhs->kind;
    this->numOutputInfos = rhs->numOutputInfos;
    (this->signature).value = (rhs->signature).value;
    paVar3 = &rhs->valueData;
    if (rhs->numOutputInfos < 2) {
      paVar4 = &this->valueData;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (paVar4->asOutputInfo).device = (paVar3->asOutputInfo).device;
        paVar3 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar3 + (ulong)bVar5 * -0x10 + 8)
        ;
        paVar4 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar4 + (ulong)bVar5 * -0x10 + 8)
        ;
      }
    }
    else {
      (this->valueData).asOutputInfo.device = (paVar3->asOutputInfo).device;
      (paVar3->asOutputInfo).device = 0;
    }
    if (((rhs->kind < SuccessfulCommandWithOutputSignature) &&
        ((0x10090U >> (rhs->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) && (this != rhs))
    {
      (this->stringValues).size = (rhs->stringValues).size;
      pcVar1 = (this->stringValues).contents;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      (this->stringValues).contents = (rhs->stringValues).contents;
      (rhs->stringValues).contents = (char *)0x0;
    }
  }
  return this;
}

Assistant:

BuildValue& operator=(BuildValue&& rhs) {
    if (this != &rhs) {
      // Release our resources.
      if (hasMultipleOutputs())
        delete[] valueData.asOutputInfos;

      // Move the data.
      kind = rhs.kind;
      numOutputInfos = rhs.numOutputInfos;
      signature = rhs.signature;
      if (rhs.hasMultipleOutputs()) {
        valueData.asOutputInfos = rhs.valueData.asOutputInfos;
        rhs.valueData.asOutputInfos = nullptr;
      } else {
        valueData.asOutputInfo = rhs.valueData.asOutputInfo;
      }
      if (rhs.kindHasStringList()) {
        stringValues = std::move(rhs.stringValues);
      }
    }
    return *this;
  }